

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

void sysbvm_integer_decodeLargeOrImmediate
               (sysbvm_context_t *context,sysbvm_decoded_integer_t *decodedInteger,
               sysbvm_tuple_t integer)

{
  _Bool _Var1;
  int iVar2;
  sysbvm_stuple_t sVar3;
  sysbvm_tuple_t sVar4;
  size_t sVar5;
  bool bVar6;
  long local_40;
  sysbvm_integer_t *integerObject;
  uint64_t decodedSmallPositive;
  sysbvm_stuple_t decodedSmall;
  sysbvm_tuple_t integer_local;
  sysbvm_decoded_integer_t *decodedInteger_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isImmediate(integer);
  if (_Var1) {
    sVar3 = sysbvm_tuple_integer_decodeSmall(integer);
    local_40 = sVar3;
    if (sVar3 < 0) {
      local_40 = -sVar3;
    }
    decodedInteger->isNegative = sVar3 < 0;
    decodedInteger->inlineWordBuffer[0] = (uint32_t)local_40;
    decodedInteger->inlineWordBuffer[1] = (uint32_t)((ulong)local_40 >> 0x20);
    decodedInteger->words = decodedInteger->inlineWordBuffer;
    iVar2 = 2;
    if (decodedInteger->inlineWordBuffer[1] == 0) {
      iVar2 = 1;
    }
    decodedInteger->wordCount = (long)iVar2;
  }
  else {
    sVar4 = sysbvm_tuple_getType(context,integer);
    decodedInteger->isNegative = sVar4 == (context->roots).largeNegativeIntegerType;
    decodedInteger->words = (uint32_t *)(integer + 0x10);
    sVar5 = sysbvm_tuple_getSizeInBytes(integer);
    decodedInteger->wordCount = sVar5 >> 2;
    while( true ) {
      bVar6 = false;
      if (1 < decodedInteger->wordCount) {
        bVar6 = decodedInteger->words[decodedInteger->wordCount - 1] == 0;
      }
      if (!bVar6) break;
      decodedInteger->wordCount = decodedInteger->wordCount - 1;
    }
  }
  return;
}

Assistant:

static void sysbvm_integer_decodeLargeOrImmediate(sysbvm_context_t *context, sysbvm_decoded_integer_t *decodedInteger, sysbvm_tuple_t integer)
{
    if(sysbvm_tuple_isImmediate(integer))
    {
        // Decode the small integer.
        sysbvm_stuple_t decodedSmall = sysbvm_tuple_integer_decodeSmall(integer);
        uint64_t decodedSmallPositive = decodedSmall >= 0 ? (uint64_t)decodedSmall : (uint64_t)(-decodedSmall);

        decodedInteger->isNegative = decodedSmall < 0;
        decodedInteger->inlineWordBuffer[0] = (uint32_t)decodedSmallPositive;
        decodedInteger->inlineWordBuffer[1] = (uint32_t)(decodedSmallPositive >> 32);
        decodedInteger->words = decodedInteger->inlineWordBuffer;
        decodedInteger->wordCount = decodedInteger->inlineWordBuffer[1] == 0 ? 1 : 2;
    }
    else
    {
        // Decode the large integer.
        sysbvm_integer_t *integerObject = (sysbvm_integer_t*)integer;
        decodedInteger->isNegative = sysbvm_tuple_getType(context, integer) == context->roots.largeNegativeIntegerType;
        decodedInteger->words = integerObject->words;
        decodedInteger->wordCount = sysbvm_tuple_getSizeInBytes(integer) / 4;

        // Normalize the word count.
        while(decodedInteger->wordCount > 1 && decodedInteger->words[decodedInteger->wordCount - 1] == 0)
            --decodedInteger->wordCount;
    }
}